

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
minja::Value::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Value *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value)

{
  bool bVar1;
  Value *this_00;
  Value local_70;
  
  bVar1 = contains(this,key);
  if (bVar1) {
    Value(&local_70,key);
    this_00 = at(this,&local_70);
    get<std::__cxx11::string>(__return_storage_ptr__,this_00);
    ~Value(&local_70);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)default_value);
  }
  return __return_storage_ptr__;
}

Assistant:

T get(const std::string & key, T default_value) const {
    if (!contains(key)) return default_value;
    return at(key).get<T>();
  }